

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::bind_buffer_base(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  deUint32 bufU;
  int maxTFSize;
  int maxUSize;
  deUint32 bufTF;
  GLuint local_4c;
  string local_48;
  GLuint local_24;
  GLuint local_20;
  GLuint local_1c;
  
  local_4c = 0x1234;
  local_1c = 0x1234;
  local_20 = 0x1234;
  local_24 = 0x1234;
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&local_4c);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8a11,local_4c);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8a11,0x10,(void *)0x0,0x88e0);
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,&local_1c);
  glu::CallLogWrapper::glBindBuffer(&ctx->super_CallLogWrapper,0x8c8e,local_1c);
  glu::CallLogWrapper::glBufferData(&ctx->super_CallLogWrapper,0x8c8e,0x10,(void *)0x0,0x88e0);
  NegativeTestContext::expectError(ctx,0);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "GL_INVALID_ENUM is generated if target is not GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BUFFER, GL_TRANSFORM_FEEDBACK_BUFFER or GL_UNIFORM_BUFFER."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBindBufferBase(&ctx->super_CallLogWrapper,0xffffffff,0,local_4c);
  NegativeTestContext::expectError(ctx,0x500);
  glu::CallLogWrapper::glBindBufferBase(&ctx->super_CallLogWrapper,0x8892,0,local_4c);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and index is greater than or equal to GL_MAX_UNIFORM_BUFFER_BINDINGS."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8a2f,(GLint *)&local_20);
  glu::CallLogWrapper::glBindBufferBase(&ctx->super_CallLogWrapper,0x8a11,local_20,local_4c);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER andindex is greater than or equal to GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x8c8b,(GLint *)&local_24);
  glu::CallLogWrapper::glBindBufferBase(&ctx->super_CallLogWrapper,0x8c8e,local_24,local_1c);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&local_4c);
  glu::CallLogWrapper::glDeleteBuffers(&ctx->super_CallLogWrapper,1,&local_1c);
  return;
}

Assistant:

void bind_buffer_base (NegativeTestContext& ctx)
{
	deUint32	bufU		= 0x1234;
	deUint32	bufTF		= 0x1234;
	int			maxUSize	= 0x1234;
	int			maxTFSize	= 0x1234;

	ctx.glGenBuffers(1, &bufU);
	ctx.glBindBuffer(GL_UNIFORM_BUFFER, bufU);
	ctx.glBufferData(GL_UNIFORM_BUFFER, 16, NULL, GL_STREAM_DRAW);

	ctx.glGenBuffers(1, &bufTF);
	ctx.glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, bufTF);
	ctx.glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, NULL, GL_STREAM_DRAW);
	ctx.expectError(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BUFFER, GL_TRANSFORM_FEEDBACK_BUFFER or GL_UNIFORM_BUFFER.");
	ctx.glBindBufferBase(-1, 0, bufU);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glBindBufferBase(GL_ARRAY_BUFFER, 0, bufU);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and index is greater than or equal to GL_MAX_UNIFORM_BUFFER_BINDINGS.");
	ctx.glGetIntegerv(GL_MAX_UNIFORM_BUFFER_BINDINGS, &maxUSize);
	ctx.glBindBufferBase(GL_UNIFORM_BUFFER, maxUSize, bufU);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER andindex is greater than or equal to GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS.");
	ctx.glGetIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, &maxTFSize);
	ctx.glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, maxTFSize, bufTF);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteBuffers(1, &bufU);
	ctx.glDeleteBuffers(1, &bufTF);
}